

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderTextWrapped(ImVec2 pos,char *text,char *text_end,float wrap_width)

{
  float font_size;
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImFont *font;
  ImGuiContext *pIVar2;
  ImU32 col;
  size_t sVar3;
  ImVec2 local_30;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  local_30 = pos;
  if (text_end == (char *)0x0) {
    sVar3 = strlen(text);
    text_end = text + sVar3;
  }
  if (text_end != text) {
    this = pIVar1->DrawList;
    font = pIVar2->Font;
    font_size = pIVar2->FontSize;
    col = GetColorU32(0,1.0);
    ImDrawList::AddText(this,font,font_size,&local_30,col,text,text_end,wrap_width,(ImVec4 *)0x0);
    if (pIVar2->LogEnabled == true) {
      LogRenderedText(&local_30,text,text_end);
    }
  }
  return;
}

Assistant:

void ImGui::RenderTextWrapped(ImVec2 pos, const char* text, const char* text_end, float wrap_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = text + strlen(text); // FIXME-OPT

    if (text != text_end)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_end, wrap_width);
        if (g.LogEnabled)
            LogRenderedText(&pos, text, text_end);
    }
}